

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O2

CURLcode Curl_rtsp_parseheader(connectdata *conn,char *header)

{
  SessionHandle *data;
  int iVar1;
  ushort **ppuVar2;
  size_t __n;
  char *pcVar3;
  uint uVar4;
  CURLcode CVar5;
  long lVar6;
  ulong uVar7;
  byte *__s1;
  byte *pbVar8;
  long CSeq;
  
  data = conn->data;
  CSeq = 0;
  iVar1 = Curl_raw_nequal("CSeq:",header,5);
  if (iVar1 == 0) {
    iVar1 = Curl_raw_nequal("Session:",header,8);
    CVar5 = CURLE_OK;
    if (iVar1 != 0) {
      lVar6 = -8 - (long)header;
      for (__s1 = (byte *)(header + 8); uVar7 = (ulong)*__s1, uVar7 != 0; __s1 = __s1 + 1) {
        ppuVar2 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar2 + uVar7 * 2 + 1) & 0x20) == 0) {
          pcVar3 = (data->set).str[0x22];
          pbVar8 = __s1;
          if (pcVar3 != (char *)0x0) {
            __n = strlen(pcVar3);
            iVar1 = strncmp((char *)__s1,pcVar3,__n);
            if (iVar1 == 0) {
              return CURLE_OK;
            }
            Curl_failf(data,"Got RTSP Session ID Line [%s], but wanted ID [%s]",__s1,pcVar3);
            return CURLE_RTSP_SESSION_ERROR;
          }
          goto LAB_00507360;
        }
        lVar6 = lVar6 + -1;
      }
      CVar5 = CURLE_OK;
      Curl_failf(data,"Got a blank Session ID");
    }
  }
  else {
    CVar5 = CURLE_OK;
    iVar1 = __isoc99_sscanf(header + 4,": %ld",&CSeq);
    if (iVar1 == 1) {
      *(long *)((long)(data->req).protop + 0x90) = CSeq;
      (data->state).rtsp_CSeq_recv = CSeq;
    }
    else {
      Curl_failf(data,"Unable to read the CSeq header: [%s]",header);
      CVar5 = CURLE_RTSP_CSEQ_ERROR;
    }
  }
  return CVar5;
LAB_00507360:
  if ((char)uVar7 == '\0') {
LAB_0050739c:
    pcVar3 = (char *)(*Curl_cmalloc)((size_t)(pbVar8 + lVar6 + 1));
    (data->set).str[0x22] = pcVar3;
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(pcVar3,__s1,(size_t)(pbVar8 + lVar6));
    (pbVar8 + (long)(data->set).str[0x22])[lVar6] = 0;
    return CURLE_OK;
  }
  if (((*ppuVar2)[uVar7] & 8) == 0) {
    uVar4 = (int)uVar7 - 0x2b;
    if (0x34 < uVar4) goto LAB_0050739c;
    if ((0x1000000000000dU >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      if (((ulong)uVar4 != 0x31) || (pbVar8[1] != 0x24)) goto LAB_0050739c;
      pbVar8 = pbVar8 + 1;
    }
  }
  uVar7 = (ulong)pbVar8[1];
  pbVar8 = pbVar8 + 1;
  goto LAB_00507360;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct connectdata *conn,
                               char *header)
{
  struct SessionHandle *data = conn->data;
  long CSeq = 0;

  if(checkprefix("CSeq:", header)) {
    /* Store the received CSeq. Match is verified in rtsp_done */
    int nc = sscanf(&header[4], ": %ld", &CSeq);
    if(nc == 1) {
      struct RTSP *rtsp = data->req.protop;
      rtsp->CSeq_recv = CSeq; /* mark the request */
      data->state.rtsp_CSeq_recv = CSeq; /* update the handle */
    }
    else {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
  }
  else if(checkprefix("Session:", header)) {
    char *start;

    /* Find the first non-space letter */
    start = header + 8;
    while(*start && ISSPACE(*start))
      start++;

    if(!*start) {
      failf(data, "Got a blank Session ID");
    }
    else if(data->set.str[STRING_RTSP_SESSION_ID]) {
      /* If the Session ID is set, then compare */
      if(strncmp(start, data->set.str[STRING_RTSP_SESSION_ID],
                 strlen(data->set.str[STRING_RTSP_SESSION_ID]))  != 0) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then
         set it */

      /* The session ID can be an alphanumeric or a 'safe' character
       *
       * RFC 2326 15.1 Base Syntax:
       * safe =  "\$" | "-" | "_" | "." | "+"
       * */
      char *end = start;
      while(*end &&
            (ISALNUM(*end) || *end == '-' || *end == '_' || *end == '.' ||
             *end == '+' ||
             (*end == '\\' && *(end + 1) && *(end + 1) == '$' && (++end, 1))))
        end++;

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = malloc(end - start + 1);
      if(data->set.str[STRING_RTSP_SESSION_ID] == NULL)
        return CURLE_OUT_OF_MEMORY;
      memcpy(data->set.str[STRING_RTSP_SESSION_ID], start, end - start);
      (data->set.str[STRING_RTSP_SESSION_ID])[end - start] = '\0';
    }
  }
  return CURLE_OK;
}